

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBuildPrograms.cpp
# Opt level: O1

void __thiscall vkt::anon_unknown_0::TaskExecutor::~TaskExecutor(TaskExecutor *this)

{
  Task *in_RAX;
  pointer pSVar1;
  ulong uVar2;
  long lVar3;
  Task *local_28;
  
  local_28 = in_RAX;
  if ((this->m_threads).
      super__Vector_base<de::SharedPtr<vkt::(anonymous_namespace)::TaskExecutorThread>,_std::allocator<de::SharedPtr<vkt::(anonymous_namespace)::TaskExecutorThread>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->m_threads).
      super__Vector_base<de::SharedPtr<vkt::(anonymous_namespace)::TaskExecutorThread>,_std::allocator<de::SharedPtr<vkt::(anonymous_namespace)::TaskExecutorThread>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar2 = 0;
    do {
      local_28 = (Task *)0x0;
      de::ThreadSafeRingBuffer<vkt::(anonymous_namespace)::Task_*>::pushFront
                (&this->m_tasks,&local_28);
      uVar2 = uVar2 + 1;
    } while (uVar2 < (ulong)((long)(this->m_threads).
                                   super__Vector_base<de::SharedPtr<vkt::(anonymous_namespace)::TaskExecutorThread>,_std::allocator<de::SharedPtr<vkt::(anonymous_namespace)::TaskExecutorThread>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->m_threads).
                                   super__Vector_base<de::SharedPtr<vkt::(anonymous_namespace)::TaskExecutorThread>,_std::allocator<de::SharedPtr<vkt::(anonymous_namespace)::TaskExecutorThread>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 4));
  }
  pSVar1 = (this->m_threads).
           super__Vector_base<de::SharedPtr<vkt::(anonymous_namespace)::TaskExecutorThread>,_std::allocator<de::SharedPtr<vkt::(anonymous_namespace)::TaskExecutorThread>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_threads).
      super__Vector_base<de::SharedPtr<vkt::(anonymous_namespace)::TaskExecutorThread>,_std::allocator<de::SharedPtr<vkt::(anonymous_namespace)::TaskExecutorThread>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pSVar1) {
    lVar3 = 0;
    uVar2 = 0;
    do {
      de::Thread::join(*(Thread **)((long)&pSVar1->m_ptr + lVar3));
      uVar2 = uVar2 + 1;
      pSVar1 = (this->m_threads).
               super__Vector_base<de::SharedPtr<vkt::(anonymous_namespace)::TaskExecutorThread>,_std::allocator<de::SharedPtr<vkt::(anonymous_namespace)::TaskExecutorThread>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar3 = lVar3 + 0x10;
    } while (uVar2 < (ulong)((long)(this->m_threads).
                                   super__Vector_base<de::SharedPtr<vkt::(anonymous_namespace)::TaskExecutorThread>,_std::allocator<de::SharedPtr<vkt::(anonymous_namespace)::TaskExecutorThread>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar1 >> 4));
  }
  de::ThreadSafeRingBuffer<vkt::(anonymous_namespace)::Task_*>::~ThreadSafeRingBuffer
            (&this->m_tasks);
  std::
  vector<de::SharedPtr<vkt::(anonymous_namespace)::TaskExecutorThread>,_std::allocator<de::SharedPtr<vkt::(anonymous_namespace)::TaskExecutorThread>_>_>
  ::~vector(&this->m_threads);
  return;
}

Assistant:

TaskExecutor::~TaskExecutor (void)
{
	for (size_t ndx = 0; ndx < m_threads.size(); ++ndx)
		m_tasks.pushFront(DE_NULL);

	for (size_t ndx = 0; ndx < m_threads.size(); ++ndx)
		m_threads[ndx]->join();
}